

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

char * make_ARB1_srcarg_string_in_buf(Context *ctx,SourceArgInfo *arg,char *buf,size_t buflen)

{
  SourceMod SVar1;
  MOJOSHADER_shaderType shader_type;
  RegisterType rtype;
  uint uVar2;
  int iVar3;
  char *buf_00;
  ulong *buf_01;
  char acStack_178 [56];
  undefined8 local_140;
  char acStack_138 [56];
  undefined8 uStack_100;
  ulong local_f8;
  bool local_ee;
  bool local_ed;
  int local_ec;
  ulong uStack_e8;
  int scalar;
  size_t i;
  char *pcStack_d8;
  char swizzle_str [6];
  char *postmod_str;
  char *premod_str;
  char *stackbuf;
  size_t len;
  int inplace;
  SourceMod mod;
  int offset;
  int arraysize;
  int arrayidx;
  char *rel_regtype_str;
  char *pcStack_90;
  char rel_swizzle [4];
  char *rel_rbracket;
  char rel_offset [32];
  char *rel_lbracket;
  char *regtype_str;
  char regnum_str [16];
  size_t buflen_local;
  char *buf_local;
  SourceArgInfo *arg_local;
  Context *ctx_local;
  
  buf_01 = &local_f8;
  uStack_100 = 0x120cf2;
  regnum_str._8_8_ = buflen;
  memset(&regtype_str,0,0x10);
  rel_lbracket = (char *)0x0;
  if (arg->relative == 0) {
    uStack_100 = 0x120d25;
    rel_lbracket = get_ARB1_register_string(ctx,arg->regtype,arg->regnum,(char *)&regtype_str,0x10);
  }
  rel_offset._24_8_ = (long)"\n\nUSAGE: %s <profile> [file1] ... [fileN]\n\n" + 0x2b;
  uStack_100 = 0x120d44;
  memset(&rel_rbracket,0,0x20);
  pcStack_90 = "";
  uStack_100 = 0x120d65;
  memset((void *)((long)&rel_regtype_str + 4),0,4);
  _arraysize = "";
  if (arg->relative != 0) {
    buf_01 = (ulong *)acStack_138;
    local_140 = 0x120da4;
    _arraysize = get_ARB1_varname_in_buf
                           (ctx,arg->relative_regtype,arg->relative_regnum,(char *)buf_01,0x40);
    rel_regtype_str._4_1_ = 0x2e;
    rel_regtype_str._5_1_ = "xyzw"[arg->relative_component];
    rel_regtype_str._6_1_ = 0;
    if (ctx->profile_supports_nv2 == 0) {
      if (arg->relative_regtype != REG_TYPE_ADDRESS) {
        local_140 = 0x120e0d;
        __assert_fail("arg->relative_regtype == REG_TYPE_ADDRESS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x193f,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      if (arg->relative_regnum != 0) {
        local_140 = 0x120e38;
        __assert_fail("arg->relative_regnum == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1940,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      if (ctx->last_address_reg_component != arg->relative_component) {
        local_140 = 0x120e7f;
        output_line(ctx,"ARL %s.x, addr%d.%c;",_arraysize,(ulong)(uint)arg->relative_regnum,
                    (ulong)(uint)(int)"xyzw"[arg->relative_component]);
        ctx->last_address_reg_component = arg->relative_component;
      }
      rel_regtype_str._5_1_ = 'x';
    }
    if (arg->regtype == REG_TYPE_INPUT) {
      rel_lbracket = "vertex.attrib";
    }
    else {
      if (arg->regtype != REG_TYPE_CONST) {
        local_140 = 0x120edc;
        __assert_fail("arg->regtype == REG_TYPE_CONST",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1950,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      iVar3 = arg->relative_array->index;
      uVar2 = arg->regnum - iVar3;
      if ((int)uVar2 < 0) {
        local_140 = 0x120f3b;
        __assert_fail("offset >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1954,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      buf_01 = (ulong *)acStack_178;
      rel_lbracket = get_ARB1_const_array_varname_in_buf
                               (ctx,iVar3,arg->relative_array->count,(char *)buf_01,0x40);
      if (uVar2 != 0) {
        snprintf((char *)&rel_rbracket,0x20," + %d",(ulong)uVar2);
      }
    }
    rel_offset._24_8_ = anon_var_dwarf_203e;
    pcStack_90 = "]";
  }
  *(char **)((long)buf_01 + -0x20) = _arraysize;
  *(long *)((long)buf_01 + -0x18) = (long)&rel_regtype_str + 4;
  *(char ***)((long)buf_01 + -0x10) = &rel_rbracket;
  *(char **)((long)buf_01 + -8) = pcStack_90;
  *(undefined8 *)((long)buf_01 + -0x28) = 0x120ff7;
  snprintf(buf,regnum_str._8_8_,"%s%s%s%s%s%s%s",rel_lbracket,&regtype_str,rel_offset._24_8_);
  SVar1 = arg->src_mod;
  local_ed = true;
  if ((SVar1 != SRCMOD_NONE) && (local_ed = true, SVar1 != SRCMOD_NEGATE)) {
    local_ee = false;
    if (SVar1 == SRCMOD_ABS) {
      local_ee = ctx->profile_supports_nv2 != 0;
    }
    local_ed = local_ee;
  }
  buf_00 = (char *)buf_01;
  if (local_ed == false) {
    buf_00 = (char *)((long)buf_01 + -0x40);
    *(undefined8 *)((long)buf_01 + -0x48) = 0x1210a6;
    rel_lbracket = allocate_ARB1_scratch_reg_name(ctx,buf_00,0x40);
    regtype_str._0_1_ = 0;
    rel_offset._24_8_ = (long)"\n\nUSAGE: %s <profile> [file1] ... [fileN]\n\n" + 0x2b;
    pcStack_90 = "";
    rel_rbracket._0_1_ = 0;
    rel_regtype_str._4_1_ = 0;
    _arraysize = "";
  }
  postmod_str = "";
  pcStack_d8 = "";
  local_f8 = (ulong)SVar1;
  switch(local_f8) {
  case 0:
  case 0xe:
    break;
  case 1:
    postmod_str = "-";
    break;
  case 3:
    postmod_str = "-";
  case 2:
    builtin_strncpy(buf_00 + -8,"^\x11\x12",4);
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    output_line(ctx,"SUB %s, %s, { 0.5, 0.5, 0.5, 0.5 };",rel_lbracket,buf);
    break;
  case 5:
    postmod_str = "-";
  case 4:
    buf_00[-8] = -0x75;
    buf_00[-7] = '\x11';
    buf_00[-6] = '\x12';
    buf_00[-5] = '\0';
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    output_line(ctx,"MAD %s, %s, { 2.0, 2.0, 2.0, 2.0 }, { -1.0, -1.0, -1.0, -1.0 };",rel_lbracket,
                buf);
    break;
  case 6:
    buf_00[-8] = -0x56;
    buf_00[-7] = '\x11';
    buf_00[-6] = '\x12';
    buf_00[-5] = '\0';
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    output_line(ctx,"SUB %s, { 1.0, 1.0, 1.0, 1.0 }, %s;",rel_lbracket,buf);
    break;
  case 8:
    postmod_str = "-";
  case 7:
    buf_00[-8] = -0x29;
    buf_00[-7] = '\x11';
    buf_00[-6] = '\x12';
    buf_00[-5] = '\0';
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    output_line(ctx,"MUL %s, %s, { 2.0, 2.0, 2.0, 2.0 };",rel_lbracket,buf);
    break;
  case 9:
    buf_00[-8] = -0x14;
    buf_00[-7] = '\x11';
    buf_00[-6] = '\x12';
    buf_00[-5] = '\0';
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    fail(ctx,"SRCMOD_DZ currently unsupported in arb1");
    pcStack_d8 = "_dz";
    break;
  case 10:
    builtin_strncpy(buf_00 + -8,"\x0f\x12\x12",4);
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    fail(ctx,"SRCMOD_DW currently unsupported in arb1");
    pcStack_d8 = "_dw";
    break;
  case 0xc:
    postmod_str = "-";
  case 0xb:
    if (ctx->profile_supports_nv2 == 0) {
      builtin_strncpy(buf_00 + -8,"W\x12\x12",4);
      buf_00[-4] = '\0';
      buf_00[-3] = '\0';
      buf_00[-2] = '\0';
      buf_00[-1] = '\0';
      output_line(ctx,"ABS %s, %s;",rel_lbracket,buf);
    }
    else {
      postmod_str = "|";
      if (SVar1 == SRCMOD_ABSNEGATE) {
        postmod_str = "-|";
      }
      pcStack_d8 = "|";
    }
    break;
  case 0xd:
    buf_00[-8] = -0x65;
    buf_00[-7] = '\x12';
    buf_00[-6] = '\x12';
    buf_00[-5] = '\0';
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    fail(ctx,"SRCMOD_NOT currently unsupported in arb1");
    postmod_str = "!";
  }
  uStack_e8 = 0;
  if (((ctx->profile_supports_nv4 != 0) && (arg->regtype == REG_TYPE_MISCTYPE)) &&
     (arg->regnum == 1)) {
    i._2_1_ = 0x2e;
    uStack_e8 = 2;
    i._3_1_ = 0x78;
  }
  shader_type = ctx->shader_type;
  rtype = arg->regtype;
  iVar3 = arg->regnum;
  builtin_strncpy(buf_00 + -8,"8\x13\x12",4);
  buf_00[-4] = '\0';
  buf_00[-3] = '\0';
  buf_00[-2] = '\0';
  buf_00[-1] = '\0';
  local_ec = isscalar(ctx,shader_type,rtype,iVar3);
  if (local_ec == 0) {
    iVar3 = arg->swizzle;
    builtin_strncpy(buf_00 + -8,"W\x13\x12",4);
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    iVar3 = no_swizzle(iVar3);
    if (iVar3 == 0) {
      *(undefined1 *)((long)&i + uStack_e8 + 2) = 0x2e;
      iVar3 = arg->swizzle;
      buf_00[-8] = -0x77;
      buf_00[-7] = '\x13';
      buf_00[-6] = '\x12';
      buf_00[-5] = '\0';
      buf_00[-4] = '\0';
      buf_00[-3] = '\0';
      buf_00[-2] = '\0';
      buf_00[-1] = '\0';
      uStack_e8 = uStack_e8 + 1;
      iVar3 = replicate_swizzle(iVar3);
      if (iVar3 == 0) {
        *(char *)((long)&i + uStack_e8 + 2) = "xyzw"[arg->swizzle_x];
        *(char *)((long)&i + uStack_e8 + 3) = "xyzw"[arg->swizzle_y];
        *(char *)((long)&i + uStack_e8 + 4) = "xyzw"[arg->swizzle_z];
        *(char *)((long)&i + uStack_e8 + 5) = "xyzw"[arg->swizzle_w];
        uStack_e8 = uStack_e8 + 4;
      }
      else {
        *(char *)((long)&i + uStack_e8 + 2) = "xyzw"[arg->swizzle_x];
        uStack_e8 = uStack_e8 + 1;
      }
    }
  }
  *(undefined1 *)((long)&i + uStack_e8 + 2) = 0;
  if (5 < uStack_e8) {
    buf_00[-8] = -0x4b;
    buf_00[-7] = '\x14';
    buf_00[-6] = '\x12';
    buf_00[-5] = '\0';
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    __assert_fail("i < sizeof (swizzle_str)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x19de,
                  "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                 );
  }
  *(undefined8 *)(buf_00 + -0x40) = rel_offset._24_8_;
  *(char **)(buf_00 + -0x38) = _arraysize;
  *(long *)(buf_00 + -0x30) = (long)&rel_regtype_str + 4;
  *(char ***)(buf_00 + -0x28) = &rel_rbracket;
  *(char **)(buf_00 + -0x20) = pcStack_90;
  *(long *)(buf_00 + -0x18) = (long)&i + 2;
  *(char **)(buf_00 + -0x10) = pcStack_d8;
  buf_00[-0x48] = '+';
  buf_00[-0x47] = '\x15';
  buf_00[-0x46] = '\x12';
  buf_00[-0x45] = '\0';
  buf_00[-0x44] = '\0';
  buf_00[-0x43] = '\0';
  buf_00[-0x42] = '\0';
  buf_00[-0x41] = '\0';
  snprintf(buf,regnum_str._8_8_,"%s%s%s%s%s%s%s%s%s%s",postmod_str,rel_lbracket,&regtype_str);
  return buf;
}

Assistant:

static const char *make_ARB1_srcarg_string_in_buf(Context *ctx,
                                                  const SourceArgInfo *arg,
                                                  char *buf, size_t buflen)
{
    // !!! FIXME: this can hit pathological cases where we look like this...
    //
    //    dp3 r1.xyz, t0_bx2, t0_bx2
    //    mad r1.xyz, t0_bias, 1-r1, t0_bx2
    //
    // ...which do a lot of duplicate work in arb1...
    //
    //    SUB scratch0, t0, { 0.5, 0.5, 0.5, 0.5 };
    //    MUL scratch0, scratch0, { 2.0, 2.0, 2.0, 2.0 };
    //    SUB scratch1, t0, { 0.5, 0.5, 0.5, 0.5 };
    //    MUL scratch1, scratch1, { 2.0, 2.0, 2.0, 2.0 };
    //    DP3 r1.xyz, scratch0, scratch1;
    //    SUB scratch0, t0, { 0.5, 0.5, 0.5, 0.5 };
    //    SUB scratch1, { 1.0, 1.0, 1.0, 1.0 }, r1;
    //    SUB scratch2, t0, { 0.5, 0.5, 0.5, 0.5 };
    //    MUL scratch2, scratch2, { 2.0, 2.0, 2.0, 2.0 };
    //    MAD r1.xyz, scratch0, scratch1, scratch2;
    //
    // ...notice that the dp3 calculates the same value into two scratch
    //  registers. This case is easier to handle; just see if multiple
    //  source args are identical, build it up once, and use the same
    //  scratch register for multiple arguments in that opcode.
    //  Even better still, only calculate things once across instructions,
    //  and be smart about letting it linger in a scratch register until we
    //  definitely don't need the calculation anymore. That's harder to
    //  write, though.

    char regnum_str[16] = { '\0' };

    // !!! FIXME: use get_ARB1_varname_in_buf() instead?
    const char *regtype_str = NULL;
    if (!arg->relative)
    {
        regtype_str = get_ARB1_register_string(ctx, arg->regtype,
                                               arg->regnum, regnum_str,
                                               sizeof (regnum_str));
    } // if

    const char *rel_lbracket = "";
    char rel_offset[32] = { '\0' };
    const char *rel_rbracket = "";
    char rel_swizzle[4] = { '\0' };
    const char *rel_regtype_str = "";
    if (arg->relative)
    {
        rel_regtype_str = get_ARB1_varname_in_buf(ctx, arg->relative_regtype,
                                                  arg->relative_regnum,
                                                  (char *) alloca(64), 64);

        rel_swizzle[0] = '.';
        rel_swizzle[1] = swizzle_channels[arg->relative_component];
        rel_swizzle[2] = '\0';

        if (!support_nv2(ctx))
        {
            // The address register in ARB1 only allows the '.x' component, so
            //  we need to load the component we need from a temp vector
            //  register into .x as needed.
            assert(arg->relative_regtype == REG_TYPE_ADDRESS);
            assert(arg->relative_regnum == 0);
            if (ctx->last_address_reg_component != arg->relative_component)
            {
                output_line(ctx, "ARL %s.x, addr%d.%c;", rel_regtype_str,
                            arg->relative_regnum,
                            swizzle_channels[arg->relative_component]);
                ctx->last_address_reg_component = arg->relative_component;
            } // if

            rel_swizzle[1] = 'x';
        } // if

        if (arg->regtype == REG_TYPE_INPUT)
            regtype_str = "vertex.attrib";
        else
        {
            assert(arg->regtype == REG_TYPE_CONST);
            const int arrayidx = arg->relative_array->index;
            const int arraysize = arg->relative_array->count;
            const int offset = arg->regnum - arrayidx;
            assert(offset >= 0);
            regtype_str = get_ARB1_const_array_varname_in_buf(ctx, arrayidx,
                                           arraysize, (char *) alloca(64), 64);
            if (offset != 0)
                snprintf(rel_offset, sizeof (rel_offset), " + %d", offset);
        } // else

        rel_lbracket = "[";
        rel_rbracket = "]";
    } // if

    // This is the source register with everything but swizzle and source mods.
    snprintf(buf, buflen, "%s%s%s%s%s%s%s", regtype_str, regnum_str,
             rel_lbracket, rel_regtype_str, rel_swizzle, rel_offset,
             rel_rbracket);

    // Some of the source mods need to generate instructions to a temp
    //  register, in which case we'll replace the register name.
    const SourceMod mod = arg->src_mod;
    const int inplace = ( (mod == SRCMOD_NONE) || (mod == SRCMOD_NEGATE) ||
                          ((mod == SRCMOD_ABS) && support_nv2(ctx)) );

    if (!inplace)
    {
        const size_t len = 64;
        char *stackbuf = (char *) alloca(len);
        regtype_str = allocate_ARB1_scratch_reg_name(ctx, stackbuf, len);
        regnum_str[0] = '\0'; // move value to scratch register.
        rel_lbracket = "";   // scratch register won't use array.
        rel_rbracket = "";
        rel_offset[0] = '\0';
        rel_swizzle[0] = '\0';
        rel_regtype_str = "";
    } // if

    const char *premod_str = "";
    const char *postmod_str = "";
    switch (mod)
    {
        case SRCMOD_NEGATE:
            premod_str = "-";
            break;

        case SRCMOD_BIASNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_BIAS:
            output_line(ctx, "SUB %s, %s, { 0.5, 0.5, 0.5, 0.5 };",
                        regtype_str, buf);
            break;

        case SRCMOD_SIGNNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_SIGN:
            output_line(ctx,
                "MAD %s, %s, { 2.0, 2.0, 2.0, 2.0 }, { -1.0, -1.0, -1.0, -1.0 };",
                regtype_str, buf);
            break;

        case SRCMOD_COMPLEMENT:
            output_line(ctx, "SUB %s, { 1.0, 1.0, 1.0, 1.0 }, %s;",
                        regtype_str, buf);
            break;

        case SRCMOD_X2NEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_X2:
            output_line(ctx, "MUL %s, %s, { 2.0, 2.0, 2.0, 2.0 };",
                        regtype_str, buf);
            break;

        case SRCMOD_DZ:
            fail(ctx, "SRCMOD_DZ currently unsupported in arb1");
            postmod_str = "_dz";
            break;

        case SRCMOD_DW:
            fail(ctx, "SRCMOD_DW currently unsupported in arb1");
            postmod_str = "_dw";
            break;

        case SRCMOD_ABSNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_ABS:
            if (!support_nv2(ctx))  // GL_NV_vertex_program2_option adds this.
                output_line(ctx, "ABS %s, %s;", regtype_str, buf);
            else
            {
                premod_str = (mod == SRCMOD_ABSNEGATE) ? "-|" : "|";
                postmod_str = "|";
            } // else
            break;

        case SRCMOD_NOT:
            fail(ctx, "SRCMOD_NOT currently unsupported in arb1");
            premod_str = "!";
            break;

        case SRCMOD_NONE:
        case SRCMOD_TOTAL:
             break;  // stop compiler whining.
    } // switch

    char swizzle_str[6];
    size_t i = 0;

    if (support_nv4(ctx))  // vFace must be output as "vFace.x" in nv4.
    {
        if (arg->regtype == REG_TYPE_MISCTYPE)
        {
            if ( ((const MiscTypeType) arg->regnum) == MISCTYPE_TYPE_FACE )
            {
                swizzle_str[i++] = '.';
                swizzle_str[i++] = 'x';
            } // if
        } // if
    } // if

    const int scalar = isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum);
    if (!scalar && !no_swizzle(arg->swizzle))
    {
        swizzle_str[i++] = '.';

        // .xxxx is the same as .x, but .xx is illegal...scalar or full!
        if (replicate_swizzle(arg->swizzle))
            swizzle_str[i++] = swizzle_channels[arg->swizzle_x];
        else
        {
            swizzle_str[i++] = swizzle_channels[arg->swizzle_x];
            swizzle_str[i++] = swizzle_channels[arg->swizzle_y];
            swizzle_str[i++] = swizzle_channels[arg->swizzle_z];
            swizzle_str[i++] = swizzle_channels[arg->swizzle_w];
        } // else
    } // if
    swizzle_str[i] = '\0';
    assert(i < sizeof (swizzle_str));

    snprintf(buf, buflen, "%s%s%s%s%s%s%s%s%s%s", premod_str,
             regtype_str, regnum_str, rel_lbracket,
             rel_regtype_str, rel_swizzle, rel_offset, rel_rbracket,
             swizzle_str, postmod_str);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}